

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O1

void __thiscall Js::SourceTextModuleRecord::InitializeIndirectExports(SourceTextModuleRecord *this)

{
  Type *addr;
  IdentPtr pIVar1;
  IdentPtr pIVar2;
  IdentPtr pIVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  undefined4 *puVar8;
  Type *pTVar9;
  SourceTextModuleRecord *pSVar10;
  JavascriptError *pError;
  undefined1 *specifier;
  Iterator local_48;
  long local_38;
  ModuleNameRecord *exportRecord;
  
  local_38 = 0;
  local_48.list =
       &((this->indirectExportRecordList).ptr)->
        super_SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>;
  if ((SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)local_48.list !=
      (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    local_48.current = &(local_48.list)->super_SListNodeBase<Memory::ArenaAllocator>;
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    addr = &this->errorObject;
LAB_00b14d83:
    if ((SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)local_48.current ==
        (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar5) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar8 = 0;
    }
    local_48.current =
         (((SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
          &(local_48.current)->next)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)local_48.current
        != local_48.list) {
      pTVar9 = SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>::Iterator::
               Data(&local_48);
      pIVar1 = pTVar9->moduleRequest;
      pIVar2 = pTVar9->importName;
      pIVar3 = pTVar9->exportName;
      uVar6 = pIVar2->m_propertyId;
      if (uVar6 == 0xffffffff) {
        uVar6 = ScriptContext::GetOrAddPropertyIdTracked
                          ((this->scriptContext).ptr,(LPCWSTR)&pIVar2->field_0x22,pIVar2->m_cch);
        pIVar2->m_propertyId = uVar6;
      }
      specifier = &pIVar1->field_0x22;
      pSVar10 = GetChildModuleRecord(this,(LPCOLESTR)specifier);
      if (pSVar10 != (SourceTextModuleRecord *)0x0) goto code_r0x00b14e40;
      pError = JavascriptLibrary::CreateReferenceError
                         ((((this->scriptContext).ptr)->super_ScriptContextBase).javascriptLibrary);
      JavascriptError::SetErrorMessage
                (pError,-0x7ff5e9f2,(PCWSTR)specifier,(this->scriptContext).ptr);
      goto LAB_00b14ec1;
    }
  }
  return;
code_r0x00b14e40:
  if ((uVar6 != 0x70) &&
     ((iVar7 = (*(pSVar10->super_ModuleRecordBase).super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[9])
                         (pSVar10,(ulong)uVar6,0,&local_38), (char)iVar7 == '\0' || (local_38 == 0))
     )) {
    pError = JavascriptLibrary::CreateSyntaxError
                       ((((this->scriptContext).ptr)->super_ScriptContextBase).javascriptLibrary);
    JavascriptError::SetErrorMessage
              (pError,-0x7ff5e9f5,(PCWSTR)&pIVar3->field_0x22,(this->scriptContext).ptr);
LAB_00b14ec1:
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = pError;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  goto LAB_00b14d83;
}

Assistant:

void SourceTextModuleRecord::InitializeIndirectExports()
    {
        ModuleNameRecord* exportRecord = nullptr;
        if (indirectExportRecordList != nullptr)
        {
            indirectExportRecordList->Map([&](ModuleImportOrExportEntry exportEntry)
            {
                PropertyId propertyId = EnsurePropertyIdForIdentifier(exportEntry.importName);
                SourceTextModuleRecord* childModuleRecord = GetChildModuleRecord(exportEntry.moduleRequest->Psz());
                if (childModuleRecord == nullptr)
                {
                    JavascriptError* errorObj = scriptContext->GetLibrary()->CreateReferenceError();
                    JavascriptError::SetErrorMessage(errorObj, JSERR_CannotResolveModule, exportEntry.moduleRequest->Psz(), scriptContext);
                    this->errorObject = errorObj;
                    return;
                }
                if (propertyId != PropertyIds::star_ &&
                    (!childModuleRecord->ResolveExport(propertyId, nullptr, &exportRecord) ||
                    (exportRecord == nullptr)))
                {
                    JavascriptError* errorObj = scriptContext->GetLibrary()->CreateSyntaxError();
                    JavascriptError::SetErrorMessage(errorObj, JSERR_ModuleResolveExport, exportEntry.exportName->Psz(), scriptContext);
                    this->errorObject = errorObj;
                    return;
                }
            });
        }
    }